

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O2

void __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insertnonleaf
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          unsigned_long_long *key,int *cur,node **p,int *pp,locType *pos,locType wz)

{
  uint uVar1;
  int iVar2;
  locType *plVar3;
  node *pnVar4;
  undefined4 extraout_var_00;
  int iVar5;
  long lVar6;
  long lVar7;
  locType extraout_RDX;
  long extraout_RDX_00;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  locType *plVar11;
  ulong uVar12;
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *pDVar13;
  int local_69c;
  pair<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  lnk;
  locType tmpp [101];
  unsigned_long_long tmpk [100];
  undefined4 extraout_var;
  
  lVar9 = (long)*cur;
  if (lVar9 == -1) {
    iVar2 = (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
              )._vptr_FileManager_Base[1])();
    plVar3 = (locType *)CONCAT44(extraout_var,iVar2);
    this->root = extraout_RDX;
    this->depth = this->depth + 1;
    plVar11 = &this->root;
    *(undefined4 *)(plVar3 + 200) = 1;
    plVar3[0x65] = *key;
    *plVar3 = *pos;
    plVar3[1] = wz;
    pDVar13 = this->file;
  }
  else {
    uVar1 = pp[lVar9];
    lVar6 = (long)(int)uVar1;
    pnVar4 = p[lVar9];
    lVar7 = (long)pnVar4->sz;
    if (0x62 < lVar7) {
      tmpp[0] = (pnVar4->field_0).pointer[0];
      uVar10 = 0;
      uVar12 = 0;
      if (0 < (int)uVar1) {
        uVar12 = (ulong)uVar1;
      }
      for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
        tmpp[uVar10 + 1] = *(locType *)((long)&pnVar4->field_0 + uVar10 * 8 + 8);
        tmpk[uVar10] = pnVar4->keyvalue[uVar10];
      }
      tmpp[lVar6 + 1] = wz;
      while( true ) {
        tmpk[lVar6] = *key;
        if (99 < lVar6 + 1) break;
        tmpp[lVar6 + 2] = *(locType *)((long)&pnVar4->field_0 + lVar6 * 8 + 8);
        key = pnVar4->keyvalue + lVar6;
        lVar6 = lVar6 + 1;
      }
      pnVar4->sz = 0x32;
      iVar2 = 0x32;
      for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
        (pnVar4->field_0).val[lVar6] = tmpp[lVar6];
        pnVar4 = p[lVar9];
        pnVar4->keyvalue[lVar6] = tmpk[lVar6];
        iVar2 = pnVar4->sz;
      }
      (pnVar4->field_0).val[iVar2] = tmpp[lVar6];
      iVar2 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[1])();
      lnk.first = (node *)CONCAT44(extraout_var_00,iVar2);
      iVar2 = p[lVar9]->sz;
      uVar12 = (ulong)iVar2;
      uVar10 = uVar12;
      while (uVar8 = uVar10 + 1, (long)uVar10 < 99) {
        iVar5 = (int)uVar12;
        ((lnk.first)->field_0).val[iVar5 - iVar2] = tmpp[uVar8];
        iVar2 = p[lVar9]->sz;
        (lnk.first)->keyvalue[iVar5 - iVar2] = tmpk[uVar8];
        uVar12 = (ulong)(iVar5 + 1);
        uVar10 = uVar8;
      }
      (lnk.first)->sz = 99 - iVar2;
      ((lnk.first)->field_0).pointer[99 - iVar2] = tmpp[100];
      lnk.second = extraout_RDX_00;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])();
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])(this->file,pos + *cur);
      local_69c = *cur + -1;
      insertnonleaf(this,tmpk + p[lVar9]->sz,&local_69c,p,pp,pos,lnk.second);
      return;
    }
    for (; lVar6 < lVar7; lVar7 = lVar7 + -1) {
      pnVar4 = p[lVar9];
      pnVar4->keyvalue[lVar7] = pnVar4->keyvalue[lVar7 + -1];
      *(long *)((long)&pnVar4->field_0 + lVar7 * 8 + 8) = (pnVar4->field_0).val[lVar7];
    }
    pnVar4 = p[lVar9];
    pnVar4->keyvalue[lVar6] = *key;
    *(locType *)((long)&pnVar4->field_0 + lVar6 * 8 + 8) = wz;
    p[lVar9]->sz = p[lVar9]->sz + 1;
    pDVar13 = this->file;
    plVar11 = pos + *cur;
  }
  (*(pDVar13->
    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
    )._vptr_FileManager_Base[3])(pDVar13,plVar11);
  return;
}

Assistant:

void insertnonleaf(const Key &key, const int &cur, node **p, int *pp, locType *pos, locType wz) {
            if (cur == -1) {
                auto lnk = file->newspace();
                root = lnk.second;
                node *x = lnk.first;
                ++depth;
                x->sz = 1;
                x->keyvalue[0] = key;
                x->pointer[0] = pos[0];
                x->pointer[1] = wz;
                file->save(root);
                return;
            }
            node *&x = p[cur];
            int i, j = pp[cur];
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->pointer[i + 1] = x->pointer[i];
                x->keyvalue[j] = key;
                x->pointer[j + 1] = wz;
                ++x->sz;
                file->save(pos[cur]);
            } else {
                locType tmpp[degree + 1];
                Key tmpk[degree];
                tmpp[0] = x->pointer[0];
                for (i = 0; i < j; ++i)tmpp[i + 1] = x->pointer[i + 1], tmpk[i] = x->keyvalue[i];
                tmpp[j + 1] = wz;
                tmpk[j] = key;
                for (i = j + 1; i < degree; ++i)tmpp[i + 1] = x->pointer[i], tmpk[i] = x->keyvalue[i - 1];
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->pointer[i] = tmpp[i], x->keyvalue[i] = tmpk[i];
                x->pointer[x->sz] = tmpp[i];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = x->sz + 1; i < degree; ++i)
                    y->pointer[i - x->sz - 1] = tmpp[i], y->keyvalue[i - x->sz - 1] = tmpk[i];
                y->sz = degree - 1 - x->sz;
                y->pointer[y->sz] = tmpp[degree];
                file->save(lnk.second);
                file->save(pos[cur]);
                insertnonleaf(tmpk[x->sz], cur - 1, p, pp, pos, lnk.second);
            }
        }